

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.h
# Opt level: O1

void __thiscall
spvtools::opt::LoopDescriptor::LoopDescriptor(LoopDescriptor *this,LoopDescriptor *other)

{
  pointer ppLVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  
  (this->placeholder_top_loop_).nested_loops_.
  super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->placeholder_top_loop_).nested_loops_.
  super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->placeholder_top_loop_).loop_latch_ = (BasicBlock *)0x0;
  (this->placeholder_top_loop_).parent_ = (Loop *)0x0;
  (this->placeholder_top_loop_).loop_merge_ = (BasicBlock *)0x0;
  (this->placeholder_top_loop_).loop_preheader_ = (BasicBlock *)0x0;
  (this->placeholder_top_loop_).loop_header_ = (BasicBlock *)0x0;
  (this->placeholder_top_loop_).loop_continue_ = (BasicBlock *)0x0;
  (this->loops_).super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->placeholder_top_loop_).context_ = (IRContext *)0x0;
  (this->loops_).super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->loops_).super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->placeholder_top_loop_).nested_loops_.
  super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->placeholder_top_loop_).loop_basic_blocks_._M_h._M_buckets =
       &(this->placeholder_top_loop_).loop_basic_blocks_._M_h._M_single_bucket;
  (this->placeholder_top_loop_).loop_basic_blocks_._M_h._M_bucket_count = 1;
  (this->placeholder_top_loop_).loop_basic_blocks_._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)0x0;
  (this->placeholder_top_loop_).loop_basic_blocks_._M_h._M_element_count = 0;
  (this->placeholder_top_loop_).loop_basic_blocks_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->placeholder_top_loop_).loop_basic_blocks_._M_h._M_rehash_policy._M_next_resize = 0;
  (this->placeholder_top_loop_).loop_basic_blocks_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->placeholder_top_loop_).loop_is_marked_for_removal_ = false;
  (this->basic_block_to_loop_)._M_h._M_buckets = &(this->basic_block_to_loop_)._M_h._M_single_bucket
  ;
  (this->basic_block_to_loop_)._M_h._M_bucket_count = 1;
  (this->basic_block_to_loop_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->basic_block_to_loop_)._M_h._M_element_count = 0;
  (this->basic_block_to_loop_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->loops_to_add_).
  super__Vector_base<std::pair<spvtools::opt::Loop_*,_std::unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,_std::unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->loops_to_add_).
  super__Vector_base<std::pair<spvtools::opt::Loop_*,_std::unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,_std::unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->loops_to_add_).
  super__Vector_base<std::pair<spvtools::opt::Loop_*,_std::unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,_std::unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->basic_block_to_loop_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->basic_block_to_loop_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>::_M_move_assign
            (&this->loops_,other);
  ppLVar1 = (other->loops_).
            super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((other->loops_).
      super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppLVar1) {
    (other->loops_).
    super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppLVar1;
  }
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Loop_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_move_assign(&(this->basic_block_to_loop_)._M_h,&other->basic_block_to_loop_);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Loop_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(other->basic_block_to_loop_)._M_h);
  (this->placeholder_top_loop_).parent_ = (other->placeholder_top_loop_).parent_;
  uVar2 = *(undefined4 *)&(other->placeholder_top_loop_).context_;
  uVar3 = *(undefined4 *)((long)&(other->placeholder_top_loop_).context_ + 4);
  uVar4 = *(undefined4 *)&(other->placeholder_top_loop_).loop_header_;
  uVar5 = *(undefined4 *)((long)&(other->placeholder_top_loop_).loop_header_ + 4);
  uVar6 = *(undefined4 *)&(other->placeholder_top_loop_).loop_continue_;
  uVar7 = *(undefined4 *)((long)&(other->placeholder_top_loop_).loop_continue_ + 4);
  uVar8 = *(undefined4 *)&(other->placeholder_top_loop_).loop_merge_;
  uVar9 = *(undefined4 *)((long)&(other->placeholder_top_loop_).loop_merge_ + 4);
  uVar10 = *(undefined4 *)((long)&(other->placeholder_top_loop_).loop_preheader_ + 4);
  uVar11 = *(undefined4 *)&(other->placeholder_top_loop_).loop_latch_;
  uVar12 = *(undefined4 *)((long)&(other->placeholder_top_loop_).loop_latch_ + 4);
  *(undefined4 *)&(this->placeholder_top_loop_).loop_preheader_ =
       *(undefined4 *)&(other->placeholder_top_loop_).loop_preheader_;
  *(undefined4 *)((long)&(this->placeholder_top_loop_).loop_preheader_ + 4) = uVar10;
  *(undefined4 *)&(this->placeholder_top_loop_).loop_latch_ = uVar11;
  *(undefined4 *)((long)&(this->placeholder_top_loop_).loop_latch_ + 4) = uVar12;
  *(undefined4 *)&(this->placeholder_top_loop_).loop_continue_ = uVar6;
  *(undefined4 *)((long)&(this->placeholder_top_loop_).loop_continue_ + 4) = uVar7;
  *(undefined4 *)&(this->placeholder_top_loop_).loop_merge_ = uVar8;
  *(undefined4 *)((long)&(this->placeholder_top_loop_).loop_merge_ + 4) = uVar9;
  *(undefined4 *)&(this->placeholder_top_loop_).context_ = uVar2;
  *(undefined4 *)((long)&(this->placeholder_top_loop_).context_ + 4) = uVar3;
  *(undefined4 *)&(this->placeholder_top_loop_).loop_header_ = uVar4;
  *(undefined4 *)((long)&(this->placeholder_top_loop_).loop_header_ + 4) = uVar5;
  std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>::_M_move_assign
            (&(this->placeholder_top_loop_).nested_loops_,
             &(other->placeholder_top_loop_).nested_loops_);
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::_M_move_assign(&(this->placeholder_top_loop_).loop_basic_blocks_._M_h,
                   &(other->placeholder_top_loop_).loop_basic_blocks_);
  (this->placeholder_top_loop_).loop_is_marked_for_removal_ =
       (other->placeholder_top_loop_).loop_is_marked_for_removal_;
  return;
}

Assistant:

LoopDescriptor(LoopDescriptor&& other) : placeholder_top_loop_(nullptr) {
    // We need to take ownership of the Loop objects in the other
    // LoopDescriptor, to avoid double-free.
    loops_ = std::move(other.loops_);
    other.loops_.clear();
    basic_block_to_loop_ = std::move(other.basic_block_to_loop_);
    other.basic_block_to_loop_.clear();
    placeholder_top_loop_ = std::move(other.placeholder_top_loop_);
  }